

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

curltime get_max_baller_time(Curl_cfilter *cf,Curl_easy *data,int query)

{
  long lVar1;
  int iVar2;
  timediff_t tVar3;
  curltime cVar4;
  curltime newer;
  curltime older;
  eyeballer *baller;
  size_t i;
  curltime t;
  cf_he_ctx *ctx;
  int query_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  curltime tmax;
  
  t._8_8_ = cf->ctx;
  memset(&cf_local,0,0x10);
  for (baller = (eyeballer *)0x0; baller < (eyeballer *)0x2;
      baller = (eyeballer *)((long)&baller->name + 1)) {
    lVar1 = *(long *)(t._8_8_ + 0x20 + (long)baller * 8);
    memset(&i,0,0x10);
    if ((((lVar1 != 0) && (*(long *)(lVar1 + 0x28) != 0)) &&
        (iVar2 = (**(code **)(**(long **)(lVar1 + 0x28) + 0x70))
                           (*(undefined8 *)(lVar1 + 0x28),data,query,0,&i), iVar2 == 0)) &&
       (((i != 0 || ((int)t.tv_sec != 0)) &&
        (newer.tv_usec = (int)t.tv_sec, newer.tv_sec = i, older.tv_usec = (int)tmax.tv_sec,
        older.tv_sec = (time_t)cf_local, newer._12_4_ = 0, older._12_4_ = 0,
        tVar3 = Curl_timediff_us(newer,older), 0 < tVar3)))) {
      cf_local = (Curl_cfilter *)i;
      tmax.tv_sec._0_4_ = (int)t.tv_sec;
    }
  }
  cVar4.tv_usec = (int)tmax.tv_sec;
  cVar4.tv_sec = (time_t)cf_local;
  cVar4._12_4_ = 0;
  return cVar4;
}

Assistant:

static struct curltime get_max_baller_time(struct Curl_cfilter *cf,
                                          struct Curl_easy *data,
                                          int query)
{
  struct cf_he_ctx *ctx = cf->ctx;
  struct curltime t, tmax;
  size_t i;

  memset(&tmax, 0, sizeof(tmax));
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    struct eyeballer *baller = ctx->baller[i];

    memset(&t, 0, sizeof(t));
    if(baller && baller->cf &&
       !baller->cf->cft->query(baller->cf, data, query, NULL, &t)) {
      if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
        tmax = t;
    }
  }
  return tmax;
}